

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::AddLinkDirectoryForTarget(cmMakefile *this,string *target,string *d)

{
  bool bVar1;
  iterator iVar2;
  ostream *poVar3;
  string sStack_1b8;
  ostringstream e;
  
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->Targets)._M_h,target);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
      ._M_cur == (__node_type *)0x0) {
    cmSystemTools::Error
              ("Attempt to add link directories to non-existent target: ",(target->_M_dataplus)._M_p
               ," for directory ",(d->_M_dataplus)._M_p);
    return;
  }
  bVar1 = IsAlias(this,target);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar3 = std::operator<<((ostream *)&e,"ALIAS target \"");
    poVar3 = std::operator<<(poVar3,(string *)target);
    poVar3 = std::operator<<(poVar3,"\" ");
    std::operator<<(poVar3,"may not be linked into another target.");
    std::__cxx11::stringbuf::str();
    IssueMessage(this,FATAL_ERROR,&sStack_1b8);
    std::__cxx11::string::~string((string *)&sStack_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    return;
  }
  cmTarget::AddLinkDirectory
            ((cmTarget *)
             ((long)iVar2.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                    ._M_cur + 0x28),d);
  return;
}

Assistant:

void cmMakefile::AddLinkDirectoryForTarget(const std::string& target,
                                           const std::string& d)
{
  cmTargets::iterator i = this->Targets.find(target);
  if ( i != this->Targets.end())
    {
    if(this->IsAlias(target))
      {
      std::ostringstream e;
      e << "ALIAS target \"" << target << "\" "
        << "may not be linked into another target.";
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
      }
    i->second.AddLinkDirectory( d );
    }
  else
    {
    cmSystemTools::Error
      ("Attempt to add link directories to non-existent target: ",
       target.c_str(), " for directory ", d.c_str());
    }
}